

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O0

bool __thiscall
lunasvg::SVGEnumeration<lunasvg::Units>::parseEnum<2u>
          (SVGEnumeration<lunasvg::Units> *this,string_view input,
          SVGEnumerationEntry<lunasvg::Units> (*entries) [2])

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  SVGEnumerationEntry<lunasvg::Units> *entry;
  SVGEnumerationEntry<lunasvg::Units> *__end0;
  SVGEnumerationEntry<lunasvg::Units> *__begin0;
  SVGEnumerationEntry<lunasvg::Units> (*__range2) [2];
  SVGEnumerationEntry<lunasvg::Units> (*entries_local) [2];
  SVGEnumeration<lunasvg::Units> *this_local;
  string_view input_local;
  
  input_local._M_len = (size_t)input._M_str;
  this_local = (SVGEnumeration<lunasvg::Units> *)input._M_len;
  stripLeadingAndTrailingSpaces((string_view *)&this_local);
  __end0 = *entries;
  while( true ) {
    if (__end0 == entries[1]) {
      return false;
    }
    __x._M_str = (char *)input_local._M_len;
    __x._M_len = (size_t)this_local;
    bVar1 = std::operator==(__x,__end0->second);
    if (bVar1) break;
    __end0 = __end0 + 1;
  }
  (this->super_SVGProperty).field_0x9 = __end0->first;
  return true;
}

Assistant:

bool SVGEnumeration<Enum>::parseEnum(std::string_view input, const SVGEnumerationEntry<Enum>(&entries)[N])
{
    stripLeadingAndTrailingSpaces(input);
    for(const auto& entry : entries) {
        if(input == entry.second) {
            m_value = entry.first;
            return true;
        }
    }

    return false;
}